

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O1

void adt_list_insert_unique(adt_list_t *self,void *pItem)

{
  adt_list_elem_t *paVar1;
  adt_list_elem_t *paVar2;
  adt_list_t *paVar3;
  
  if (self != (adt_list_t *)0x0) {
    paVar1 = self->pFirst;
    while( true ) {
      if (paVar1 == (adt_list_elem_t *)0x0) {
        if ((self != (adt_list_t *)0x0) &&
           (paVar1 = adt_list_elem_new(pItem,(adt_list_elem_t *)0x0,self->pLast),
           paVar1 != (adt_list_elem_t *)0x0)) {
          paVar3 = (adt_list_t *)&self->pLast;
          paVar2 = *(adt_list_elem_t **)paVar3;
          if ((paVar2 == (adt_list_elem_t *)0x0) &&
             (paVar2 = (adt_list_elem_t *)paVar3, paVar3 = self,
             self->pFirst != (adt_list_elem_t *)0x0)) {
            __assert_fail("self->pFirst == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_list.c"
                          ,0x6f,"void adt_list_insert(adt_list_t *, void *)");
          }
          paVar2->pNext = paVar1;
          paVar3->pFirst = paVar1;
        }
        return;
      }
      if (paVar1->pItem == pItem) break;
      paVar1 = paVar1->pNext;
    }
  }
  return;
}

Assistant:

void adt_list_insert_unique(adt_list_t *self, void *pItem)
{
   if (self != 0)
   {
      adt_list_elem_t *pIter = self->pFirst; //create a local iterator
      while( pIter != 0 )
      {
         adt_list_elem_t *pNext = pIter->pNext;
         if (pIter->pItem == pItem)
         {
            return; //pItem already in list
         }
         pIter=pNext;
      }
      adt_list_insert(self, pItem);
   }
}